

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O0

void forlist(LexState *ls,TString *indexname)

{
  byte bVar1;
  int iVar2;
  int nexps;
  TString *name;
  int base;
  int line;
  int nvars;
  expdesc e;
  FuncState *fs;
  TString *indexname_local;
  LexState *ls_local;
  
  e._16_8_ = ls->fs;
  base = 4;
  bVar1 = ((FuncState *)e._16_8_)->freereg;
  new_localvarliteral_(ls,"(for generator)",0xf);
  new_localvarliteral_(ls,"(for state)",0xb);
  new_localvarliteral_(ls,"(for control)",0xd);
  new_localvar(ls,indexname);
  while( true ) {
    iVar2 = testnext(ls,0x2c);
    if (iVar2 == 0) break;
    name = str_checkname(ls);
    new_localvar(ls,name);
    base = base + 1;
  }
  checknext(ls,0x10c);
  iVar2 = ls->linenumber;
  nexps = explist(ls,(expdesc *)&line);
  adjust_assign(ls,3,nexps,(expdesc *)&line);
  luaK_checkstack((FuncState *)e._16_8_,3);
  forbody(ls,(uint)bVar1,iVar2,base + -3,0);
  return;
}

Assistant:

static void forlist (LexState *ls, TString *indexname) {
  /* forlist -> NAME {,NAME} IN explist forbody */
  FuncState *fs = ls->fs;
  expdesc e;
  int nvars = 4;  /* gen, state, control, plus at least one declared var */
  int line;
  int base = fs->freereg;
  /* create control variables */
  new_localvarliteral(ls, "(for generator)");
  new_localvarliteral(ls, "(for state)");
  new_localvarliteral(ls, "(for control)");
  /* create declared variables */
  new_localvar(ls, indexname);
  while (testnext(ls, ',')) {
    new_localvar(ls, str_checkname(ls));
    nvars++;
  }
  checknext(ls, TK_IN);
  line = ls->linenumber;
  adjust_assign(ls, 3, explist(ls, &e), &e);
  luaK_checkstack(fs, 3);  /* extra space to call generator */
  forbody(ls, base, line, nvars - 3, 0);
}